

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

void __thiscall
CompositedBupOutputter::newFace
          (CompositedBupOutputter *this,Image *img,Point pos,string *name,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  bool bVar1;
  char *in_RDI;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_00000028;
  Image *in_stack_00000030;
  Image *in_stack_00000038;
  Point in_stack_00000040;
  Image *in_stack_ffffffffffffff38;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  vector<MaskRect,_std::allocator<MaskRect>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff88;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff90;
  string local_68 [32];
  string local_48 [72];
  
  Image::operator=((Image *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd0),"");
  bVar1 = Image::empty((Image *)0x127181);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x90),(string *)(in_RDI + 0x50));
  }
  else {
    std::operator+(in_stack_ffffffffffffff68,in_RDI);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    this_00 = local_48;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x90),this_00);
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string(local_68);
    this_01 = (vector<MaskRect,_std::allocator<MaskRect>_> *)&stack0xffffffffffffff68;
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Image::drawOnto(in_stack_00000038,in_stack_00000030,in_stack_00000040,in_stack_00000028);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector(this_01);
  }
  return;
}

Assistant:

void newFace(const Image& img, Point pos, const std::string& name, const std::vector<MaskRect>& mask) override {
		withFace = base;
		withMouthName = "";
		if (img.empty()) {
			withFaceName = baseName;
		} else {
			withFaceName = baseName + "_" + name;
			img.drawOnto(withFace, pos, mask);
		}
	}